

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_ErrorJoinsRecords::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_ErrorJoinsRecords t;
  
  _Test_ErrorJoinsRecords((_Test_ErrorJoinsRecords *)local_98);
  _Run((_Test_ErrorJoinsRecords *)local_98);
  ~_Test_ErrorJoinsRecords((_Test_ErrorJoinsRecords *)local_98);
  return;
}

Assistant:

TEST(LogTest, ErrorJoinsRecords) {
  // Consider two fragmented records:
  //    first(R1) last(R1) first(R2) last(R2)
  // where the middle two fragments disappear.  We do not want
  // first(R1),last(R2) to get joined and returned as a valid record.

  // Write records that span two blocks
  Write(BigString("foo", kBlockSize));
  Write(BigString("bar", kBlockSize));
  Write("correct");

  // Wipe the middle block
  for (int offset = kBlockSize; offset < 2 * kBlockSize; offset++) {
    SetByte(offset, 'x');
  }

  ASSERT_EQ("correct", Read());
  ASSERT_EQ("EOF", Read());
  const size_t dropped = DroppedBytes();
  ASSERT_LE(dropped, 2 * kBlockSize + 100);
  ASSERT_GE(dropped, 2 * kBlockSize);
}